

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathPopNodeSet(xmlXPathParserContextPtr ctxt)

{
  xmlNodeSetPtr pxVar1;
  xmlXPathObjectPtr obj;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (ctxt->value == (xmlXPathObjectPtr)0x0) {
      xmlXPathErr(ctxt,10);
      ctxt->error = 10;
    }
    else {
      if ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE) {
        obj = xmlXPathValuePop(ctxt);
        pxVar1 = obj->nodesetval;
        obj->nodesetval = (xmlNodeSetPtr)0x0;
        xmlXPathReleaseObject(ctxt->context,obj);
        return pxVar1;
      }
      xmlXPathErr(ctxt,0xb);
      ctxt->error = 0xb;
    }
  }
  return (xmlNodeSetPtr)0x0;
}

Assistant:

xmlNodeSetPtr
xmlXPathPopNodeSet (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    xmlNodeSetPtr ret;

    if (ctxt == NULL) return(NULL);
    if (ctxt->value == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    if (!xmlXPathStackIsNodeSet(ctxt)) {
	xmlXPathSetTypeError(ctxt);
	return(NULL);
    }
    obj = xmlXPathValuePop(ctxt);
    ret = obj->nodesetval;
    obj->nodesetval = NULL;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}